

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

MCTOOLS_FILE_t * mctools_fopen(mcu8str *rawpath,char *mode)

{
  int iVar1;
  FILE *pFVar2;
  mcu8str path;
  mcu8str pathcopy;
  char buf [4096];
  
  mctools_impl_view_no_winnamespace(&path,rawpath);
  iVar1 = mcu8str_contains(&path,'\\');
  if (iVar1 != 0) {
    pathcopy.owns_memory = 0;
    pathcopy.c_str = buf;
    buf[0] = '\0';
    pathcopy.size = 0;
    pathcopy.buflen = 0x1000;
    mcu8str_assign(&pathcopy,&path);
    mctools_pathseps_platform(&pathcopy);
    pFVar2 = fopen(pathcopy.c_str,mode);
    mcu8str_dealloc(&pathcopy);
    return (MCTOOLS_FILE_t *)pFVar2;
  }
  pFVar2 = fopen(path.c_str,mode);
  return (MCTOOLS_FILE_t *)pFVar2;
}

Assistant:

MCTOOLS_FILE_t * mctools_fopen( const mcu8str* rawpath,
                                  const char * mode )
  {
    mcu8str path = mctools_impl_view_no_winnamespace( rawpath );

    //Utf8-encoded paths are used directly on platforms except Windows, where
    //only ASCII encoded paths can be used directly. We also run paths through
    //mctools_pathseps_platform.
#ifdef MC_IS_WINDOWS
    //Ok, non-ASCII path on windows. Reencode as wide strings and use _wfopen:
    mcwinstr wpath = mc_path2wpath( &path );//this also maps to native path sep
    char buf[32];
    mcu8str mcu8str_mode = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_append_cstr(&mcu8str_mode,mode);
    mcwinstr wmode = mc_u8str_to_winstr( &mcu8str_mode );
    //    MCTOOLS_FILE_t * result = _wfopen( wpath.c_str, wmode.c_str );//nb: no STDNS here on purpose
    MCTOOLS_FILE_t * result = NULL;
    errno_t errno_result = _wfopen_s( &result, wpath.c_str, wmode.c_str );
    mcu8str_dealloc(&mcu8str_mode);
    mc_winstr_dealloc( &wpath );
    mc_winstr_dealloc( &wmode );
    if ( errno_result != 0 ) {
      if ( result )
        fclose(result);//a bit weird, but most likely we won't get here.
      return NULL;
    }
    return result;
#else
    if ( !mcu8str_contains( &path, '\\' ) ) {
      //Usual case on unix -> no extra work needed
      return STDNS fopen( path.c_str, mode );
    } else {
      //Copy path so we can run it through mctools_pathseps_platform:
      char buf[4096];
      mcu8str pathcopy = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
      mcu8str_assign( &pathcopy, &path );
      mctools_pathseps_platform( &pathcopy );
      MCTOOLS_FILE_t * fh = STDNS fopen( pathcopy.c_str, mode );
      mcu8str_dealloc(&pathcopy);
      return fh;
    }
#endif
  }